

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadratictetra.cpp
# Opt level: O2

int __thiscall pzgeom::TPZQuadraticTetra::ClassId(TPZQuadraticTetra *this)

{
  uint uVar1;
  int iVar2;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"TPZQuadraticTetra",&local_39);
  uVar1 = Hash(&local_38);
  iVar2 = TPZNodeRep<10,_pztopology::TPZTetrahedron>::ClassId
                    (&this->super_TPZNodeRep<10,_pztopology::TPZTetrahedron>);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZQuadraticTetra::ClassId() const{
    return Hash("TPZQuadraticTetra") ^ TPZNodeRep<10,pztopology::TPZTetrahedron>::ClassId() << 1;
}